

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O2

void __thiscall eglu::anon_unknown_1::RenderContext::postIterate(RenderContext *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  ResourceError *pRVar5;
  allocator<char> local_a1;
  int newHeight;
  int newWidth;
  RenderTarget local_60;
  code *local_38;
  int local_30;
  long *plVar4;
  
  iVar3 = (*this->m_display->_vptr_NativeDisplay[2])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (this->m_window == (NativeWindow *)0x0) {
    (*(this->m_glFunctions).flush)();
    return;
  }
  iVar3 = (**(code **)(*plVar4 + 0x188))(plVar4,this->m_eglDisplay,this->m_eglSurface);
  local_30 = (**(code **)(*plVar4 + 0xf8))(plVar4);
  if (((iVar3 == 0) && (local_30 != 0x300b)) && (local_30 != 0x300d)) {
    pRVar5 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newWidth,"eglSwapBuffers() failed: ",&local_a1);
    local_38 = getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&newHeight,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newWidth,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newHeight);
    tcu::ResourceError::ResourceError(pRVar5,(string *)&local_60);
    __cxa_throw(pRVar5,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  (*this->m_window->_vptr_NativeWindow[4])();
  if (iVar3 == 0) {
    pRVar5 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newWidth,"eglSwapBuffers() failed: ",&local_a1);
    local_38 = getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&newHeight,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newWidth,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newHeight);
    tcu::ResourceError::ResourceError(pRVar5,(string *)&local_60);
    __cxa_throw(pRVar5,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  newWidth = 0;
  newHeight = 0;
  (**(code **)(*plVar4 + 0x158))(plVar4,this->m_eglDisplay,this->m_eglSurface,0x3057,&newWidth);
  (**(code **)(*plVar4 + 0x158))(plVar4,this->m_eglDisplay,this->m_eglSurface,0x3056,&newHeight);
  err = (**(code **)(*plVar4 + 0xf8))(plVar4);
  checkError(err,"Failed to query window size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x232);
  uVar1 = (this->m_glRenderTarget).m_width;
  if (newWidth == uVar1) {
    uVar2 = (this->m_glRenderTarget).m_height;
    if (newHeight == uVar2) {
      return;
    }
  }
  else {
    uVar2 = (this->m_glRenderTarget).m_height;
  }
  tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
             (ulong)uVar1,(ulong)uVar2,(ulong)(uint)newWidth,(ulong)(uint)newHeight);
  tcu::RenderTarget::RenderTarget
            (&local_60,newWidth,newHeight,&(this->m_glRenderTarget).m_pixelFormat,
             (this->m_glRenderTarget).m_depthBits,(this->m_glRenderTarget).m_stencilBits,
             (this->m_glRenderTarget).m_numSamples);
  (this->m_glRenderTarget).m_numSamples = local_60.m_numSamples;
  (this->m_glRenderTarget).m_pixelFormat.blueBits = local_60.m_pixelFormat.blueBits;
  (this->m_glRenderTarget).m_pixelFormat.alphaBits = local_60.m_pixelFormat.alphaBits;
  (this->m_glRenderTarget).m_depthBits = local_60.m_depthBits;
  (this->m_glRenderTarget).m_stencilBits = local_60.m_stencilBits;
  (this->m_glRenderTarget).m_width = local_60.m_width;
  (this->m_glRenderTarget).m_height = local_60.m_height;
  (this->m_glRenderTarget).m_pixelFormat.redBits = local_60.m_pixelFormat.redBits;
  (this->m_glRenderTarget).m_pixelFormat.greenBits = local_60.m_pixelFormat.greenBits;
  return;
}

Assistant:

void RenderContext::postIterate (void)
{
	const Library& egl = m_display->getLibrary();

	if (m_window)
	{
		EGLBoolean	swapOk		= egl.swapBuffers(m_eglDisplay, m_eglSurface);
		EGLint		error		= egl.getError();
		const bool	badWindow	= error == EGL_BAD_SURFACE || error == EGL_BAD_NATIVE_WINDOW;

		if (!swapOk && !badWindow)
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());

		try
		{
			m_window->processEvents();
		}
		catch (const WindowDestroyedError&)
		{
			tcu::print("Warning: Window destroyed, recreating...\n");

			EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
			EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));
			m_eglSurface = EGL_NO_SURFACE;

			delete m_window;
			m_window = DE_NULL;

			try
			{
				WindowSurfacePair windowSurface = createWindow(m_display, m_nativeWindowFactory, m_eglDisplay, m_eglConfig, m_renderConfig);
				m_window		= windowSurface.first;
				m_eglSurface	= windowSurface.second;

				EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

				swapOk	= EGL_TRUE;
				error	= EGL_SUCCESS;
			}
			catch (const std::exception& e)
			{
				if (m_eglSurface)
				{
					egl.makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
					egl.destroySurface(m_eglDisplay, m_eglSurface);
					m_eglSurface = EGL_NO_SURFACE;
				}

				delete m_window;
				m_window = DE_NULL;

				throw tcu::ResourceError(string("Failed to re-create window: ") + e.what());
			}
		}

		if (!swapOk)
		{
			DE_ASSERT(badWindow);
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());
		}

		// Refresh dimensions
		{
			int	newWidth	= 0;
			int	newHeight	= 0;

			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_WIDTH,		&newWidth);
			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_HEIGHT,	&newHeight);
			EGLU_CHECK_MSG(egl, "Failed to query window size");

			if (newWidth	!= m_glRenderTarget.getWidth() ||
				newHeight	!= m_glRenderTarget.getHeight())
			{
				tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
						   m_glRenderTarget.getWidth(), m_glRenderTarget.getHeight(), newWidth, newHeight);

				m_glRenderTarget = tcu::RenderTarget(newWidth, newHeight,
													 m_glRenderTarget.getPixelFormat(),
													 m_glRenderTarget.getDepthBits(),
													 m_glRenderTarget.getStencilBits(),
													 m_glRenderTarget.getNumSamples());
			}
		}
	}
	else
		m_glFunctions.flush();
}